

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

void __thiscall
el::base::DefaultLogDispatchCallback::dispatch(DefaultLogDispatchCallback *this,string_t *logLine)

{
  LogMessage *pLVar1;
  bool bVar2;
  fstream_t *fs;
  
  if (this->m_data->m_dispatchAction != NormalLog) {
    return;
  }
  pLVar1 = this->m_data->m_logMessage;
  bVar2 = TypedConfigurations::toFile(pLVar1->m_logger->m_typedConfigurations,pLVar1->m_level);
  if ((((bVar2) &&
       (pLVar1 = this->m_data->m_logMessage,
       fs = TypedConfigurations::fileStream(pLVar1->m_logger->m_typedConfigurations,pLVar1->m_level)
       , fs != (fstream_t *)0x0)) &&
      (std::ostream::write((char *)(fs + 0x10),(long)(logLine->_M_dataplus)._M_p),
      ((byte)fs[*(long *)(*(long *)fs + -0x18) + 0x20] & 5) == 0)) &&
     (((*(byte *)(elStorage + 0x18) & 0x10) != 0 ||
      (pLVar1 = this->m_data->m_logMessage,
      bVar2 = Logger::isFlushNeeded(pLVar1->m_logger,pLVar1->m_level), bVar2)))) {
    pLVar1 = this->m_data->m_logMessage;
    Logger::flush(pLVar1->m_logger,pLVar1->m_level,fs);
  }
  pLVar1 = this->m_data->m_logMessage;
  bVar2 = TypedConfigurations::toStandardOutput
                    (pLVar1->m_logger->m_typedConfigurations,pLVar1->m_level);
  if (!bVar2) {
    return;
  }
  if ((*(byte *)(elStorage + 0x18) & 0x40) != 0) {
    pLVar1 = this->m_data->m_logMessage;
    LogBuilder::convertToColoredOutput
              ((pLVar1->m_logger->m_logBuilder).
               super___shared_ptr<el::LogBuilder,_(__gnu_cxx::_Lock_policy)2>._M_ptr,logLine,
               pLVar1->m_level);
  }
  std::operator<<((ostream *)&std::cout,(string *)logLine);
  std::ostream::flush();
  return;
}

Assistant:

void DefaultLogDispatchCallback::dispatch(base::type::string_t&& logLine) {
  if (m_data->dispatchAction() == base::DispatchAction::NormalLog) {
    if (m_data->logMessage()->logger()->m_typedConfigurations->toFile(m_data->logMessage()->level())) {
      base::type::fstream_t* fs = m_data->logMessage()->logger()->m_typedConfigurations->fileStream(
                                    m_data->logMessage()->level());
      if (fs != nullptr) {
        fs->write(logLine.c_str(), logLine.size());
        if (fs->fail()) {
          ELPP_INTERNAL_ERROR("Unable to write log to file ["
                              << m_data->logMessage()->logger()->m_typedConfigurations->filename(m_data->logMessage()->level()) << "].\n"
                              << "Few possible reasons (could be something else):\n" << "      * Permission denied\n"
                              << "      * Disk full\n" << "      * Disk is not writable", true);
        } else {
          if (ELPP->hasFlag(LoggingFlag::ImmediateFlush)
              || (m_data->logMessage()->logger()->isFlushNeeded(m_data->logMessage()->level()))) {
            m_data->logMessage()->logger()->flush(m_data->logMessage()->level(), fs);
          }
        }
      } else {
        ELPP_INTERNAL_ERROR("Log file for [" << LevelHelper::convertToString(m_data->logMessage()->level()) << "] "
                            << "has not been configured but [TO_FILE] is configured to TRUE. [Logger ID: "
                            << m_data->logMessage()->logger()->id() << "]", false);
      }
    }
    if (m_data->logMessage()->logger()->m_typedConfigurations->toStandardOutput(m_data->logMessage()->level())) {
      if (ELPP->hasFlag(LoggingFlag::ColoredTerminalOutput))
        m_data->logMessage()->logger()->logBuilder()->convertToColoredOutput(&logLine, m_data->logMessage()->level());
      ELPP_COUT << ELPP_COUT_LINE(logLine);
    }
  }
#if defined(ELPP_SYSLOG)
  else if (m_data->dispatchAction() == base::DispatchAction::SysLog) {
    // Determine syslog priority
    int sysLogPriority = 0;
    if (m_data->logMessage()->level() == Level::Fatal)
      sysLogPriority = LOG_EMERG;
    else if (m_data->logMessage()->level() == Level::Error)
      sysLogPriority = LOG_ERR;
    else if (m_data->logMessage()->level() == Level::Warning)
      sysLogPriority = LOG_WARNING;
    else if (m_data->logMessage()->level() == Level::Info)
      sysLogPriority = LOG_INFO;
    else if (m_data->logMessage()->level() == Level::Debug)
      sysLogPriority = LOG_DEBUG;
    else
      sysLogPriority = LOG_NOTICE;
#  if defined(ELPP_UNICODE)
    char* line = base::utils::Str::wcharPtrToCharPtr(logLine.c_str());
    syslog(sysLogPriority, "%s", line);
    free(line);
#  else
    syslog(sysLogPriority, "%s", logLine.c_str());
#  endif
  }
#endif  // defined(ELPP_SYSLOG)
}